

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnvarset * copyvarset(rnnvarset *varset)

{
  rnnenum *prVar1;
  rnnvarset *prVar2;
  int *piVar3;
  long lVar4;
  size_t __size;
  
  prVar2 = (rnnvarset *)calloc(0x10,1);
  prVar1 = varset->venum;
  prVar2->venum = prVar1;
  __size = (size_t)prVar1->valsnum;
  piVar3 = (int *)calloc(4,__size);
  prVar2->variants = piVar3;
  for (lVar4 = 0; lVar4 < (long)__size; lVar4 = lVar4 + 1) {
    piVar3[lVar4] = varset->variants[lVar4];
  }
  return prVar2;
}

Assistant:

static struct rnnvarset *copyvarset (struct rnnvarset *varset) {
	struct rnnvarset *res = calloc(sizeof *res, 1);
	res->venum = varset->venum;
	res->variants = calloc(sizeof *res->variants, res->venum->valsnum);
	int i;
	for (i = 0; i < res->venum->valsnum; i++)
		res->variants[i] = varset->variants[i];
	return res;
}